

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O2

JavascriptArray * __thiscall
Js::NumberFormatPartsBuilder::ToPartsArray(NumberFormatPartsBuilder *this)

{
  code *pcVar1;
  bool bVar2;
  JavascriptArray *pJVar3;
  undefined4 *puVar4;
  UNumberFormatFields *pUVar5;
  JavascriptString *newValue;
  JavascriptString *newValue_00;
  DynamicObject *instance;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar13;
  ulong uVar12;
  
  pJVar3 = JavascriptLibrary::CreateArray
                     ((((this->sc).ptr)->super_ScriptContextBase).javascriptLibrary,0);
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  uVar9 = 0;
  uVar13 = 0;
  do {
    uVar6 = this->formattedLength;
    if (uVar6 <= uVar13) {
      return pJVar3;
    }
    pUVar5 = (this->fields).ptr;
    if (uVar13 == 0) {
      uVar10 = 0;
    }
    else {
      uVar10 = (ulong)uVar13;
      if (pUVar5[uVar13 - 1] == pUVar5[uVar10]) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                    ,0x93d,"(start == 0 || fields[start - 1] != fields[start])",
                                    "start == 0 || fields[start - 1] != fields[start]");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
        uVar6 = this->formattedLength;
        pUVar5 = (this->fields).ptr;
      }
    }
    uVar7 = uVar13 + 1;
    if (uVar13 + 1 < uVar6) {
      uVar7 = uVar6;
    }
    uVar12 = uVar10;
    uVar8 = uVar10;
    do {
      uVar8 = uVar8 + 1;
      uVar11 = uVar7;
      if (uVar6 <= uVar8) break;
      uVar11 = (int)uVar12 + 1;
      uVar12 = (ulong)uVar11;
    } while (pUVar5[uVar8] == pUVar5[uVar10]);
    newValue = GetPartTypeString(this,pUVar5[uVar10]);
    newValue_00 = JavascriptString::NewCopyBuffer
                            ((this->formatted).ptr + uVar10,uVar11 - uVar13,(this->sc).ptr);
    instance = JavascriptLibrary::CreateObject
                         ((((this->sc).ptr)->super_ScriptContextBase).javascriptLibrary,false,0);
    JavascriptOperators::InitProperty
              (&instance->super_RecyclableObject,0xf6,newValue,PropertyOperation_None);
    JavascriptOperators::InitProperty
              (&instance->super_RecyclableObject,0x197,newValue_00,PropertyOperation_None);
    (*(pJVar3->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject
      .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar3,(ulong)uVar9,instance,0);
    uVar9 = uVar9 + 1;
    uVar13 = uVar11;
  } while( true );
}

Assistant:

JavascriptArray *ToPartsArray()
        {
            JavascriptArray *ret = sc->GetLibrary()->CreateArray(0);
            int retIndex = 0;

            // With the structure of the fields array, creating the resulting parts list to return to JS is simple
            // Map set parts to the corresponding `type` value (see ECMA-402 #sec-partitionnumberpattern), and unset parts to the `literal` type
            for (charcount_t start = 0; start < formattedLength; ++retIndex)
            {
                // At the top of the loop, fields[start] should always be different from fields[start - 1] (we should be at the start of a new part),
                // since start is adjusted later in the loop to the end of the part
                AssertOrFailFast(start == 0 || fields[start - 1] != fields[start]);

                charcount_t end = start + 1;
                while (end < formattedLength && fields[end] == fields[start])
                {
                    ++end;
                }

                JavascriptString *partType = GetPartTypeString(fields[start]);
                JavascriptString *partValue = JavascriptString::NewCopyBuffer(formatted + start, end - start, sc);

                DynamicObject* part = sc->GetLibrary()->CreateObject();
                JavascriptOperators::InitProperty(part, PropertyIds::type, partType);
                JavascriptOperators::InitProperty(part, PropertyIds::value, partValue);

                ret->SetItem(retIndex, part, PropertyOperationFlags::PropertyOperation_None);

                start = end;
            }

            return ret;
        }